

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_decoder.h
# Opt level: O2

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::DecodePredictionData
          (MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,DecoderBuffer *buffer)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  CornerTable *pCVar1;
  bool bVar2;
  ulong *puVar3;
  byte bVar4;
  ulong uVar5;
  byte bVar6;
  uint32_t i;
  ulong __n;
  byte bVar7;
  reference rVar8;
  uint32_t num_orientations;
  RAnsBitDecoder decoder;
  uint local_54;
  MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  *local_50;
  RAnsBitDecoder local_48;
  
  local_54 = 0;
  local_50 = this;
  if (buffer->bitstream_version_ < 0x202) {
    bVar2 = DecoderBuffer::Decode<unsigned_int>(buffer,&local_54);
  }
  else {
    bVar2 = DecodeVarint<unsigned_int>(&local_54,buffer);
  }
  if (((bVar2 != false) && ((ulong)local_54 != 0)) &&
     (pCVar1 = (local_50->
               super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
               ).mesh_data_.corner_table_,
     local_54 <=
     (uint)((ulong)((long)(pCVar1->corner_to_vertex_map_).vector_.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pCVar1->corner_to_vertex_map_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 2))) {
    this_00 = &local_50->orientations_;
    std::vector<bool,_std::allocator<bool>_>::resize(this_00,(ulong)local_54,false);
    RAnsBitDecoder::RAnsBitDecoder(&local_48);
    bVar2 = RAnsBitDecoder::StartDecoding(&local_48,buffer);
    if (bVar2) {
      bVar6 = 0;
      bVar7 = 1;
      for (__n = 0; __n < local_54; __n = __n + 1) {
        bVar2 = RAnsBitDecoder::DecodeNextBit(&local_48);
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,__n);
        puVar3 = rVar8._M_p;
        bVar4 = bVar6 ^ bVar2;
        if (bVar4 == 0) {
          uVar5 = ~rVar8._M_mask & *puVar3;
        }
        else {
          uVar5 = rVar8._M_mask | *puVar3;
        }
        bVar6 = bVar2 ^ bVar7;
        *puVar3 = uVar5;
        bVar7 = bVar4;
      }
      bVar2 = PredictionSchemeWrapDecodingTransform<int,_int>::DecodeTransformData
                        (&(local_50->
                          super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                          ).
                          super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                          .transform_,buffer);
    }
    else {
      bVar2 = false;
    }
    RAnsBitDecoder::~RAnsBitDecoder(&local_48);
    return bVar2;
  }
  return false;
}

Assistant:

bool MeshPredictionSchemeTexCoordsDecoder<DataTypeT, TransformT, MeshDataT>::
    DecodePredictionData(DecoderBuffer *buffer) {
  // Decode the delta coded orientations.
  uint32_t num_orientations = 0;
  if (buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    if (!buffer->Decode(&num_orientations)) {
      return false;
    }
  } else {
    if (!DecodeVarint(&num_orientations, buffer)) {
      return false;
    }
  }
  if (num_orientations == 0) {
    return false;
  }
  if (num_orientations > this->mesh_data().corner_table()->num_corners()) {
    // We can't have more orientations than the maximum number of decoded
    // values.
    return false;
  }
  orientations_.resize(num_orientations);
  bool last_orientation = true;
  RAnsBitDecoder decoder;
  if (!decoder.StartDecoding(buffer)) {
    return false;
  }
  for (uint32_t i = 0; i < num_orientations; ++i) {
    if (!decoder.DecodeNextBit()) {
      last_orientation = !last_orientation;
    }
    orientations_[i] = last_orientation;
  }
  decoder.EndDecoding();
  return MeshPredictionSchemeDecoder<DataTypeT, TransformT,
                                     MeshDataT>::DecodePredictionData(buffer);
}